

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__grow_buffer_unsafe(stbi__jpeg *j)

{
  int iVar1;
  stbi_uc sVar2;
  byte bVar3;
  byte *pbVar4;
  stbi_uc *psVar5;
  stbi__context *psVar6;
  stbi_uc **ppsVar7;
  
  do {
    if (j->nomore == 0) {
      psVar6 = j->s;
      pbVar4 = psVar6->img_buffer;
      if (psVar6->img_buffer_end <= pbVar4) {
        if (psVar6->read_from_callbacks == 0) goto LAB_0011749e;
        stbi__refill_buffer(psVar6);
        pbVar4 = psVar6->img_buffer;
      }
      psVar6->img_buffer = pbVar4 + 1;
      bVar3 = *pbVar4;
      if (bVar3 == 0xff) {
        psVar6 = j->s;
        ppsVar7 = &psVar6->img_buffer;
        psVar5 = psVar6->img_buffer;
        if (psVar5 < psVar6->img_buffer_end) goto LAB_00117504;
        if (psVar6->read_from_callbacks != 0) goto LAB_00117534;
        sVar2 = '\0';
LAB_0011750d:
        if (sVar2 == 0xff) {
          psVar6 = j->s;
          psVar5 = psVar6->img_buffer;
          if (psVar6->img_buffer_end <= psVar5) break;
          ppsVar7 = &psVar6->img_buffer;
          goto LAB_00117504;
        }
        if (sVar2 != '\0') {
          j->marker = sVar2;
          j->nomore = 1;
          return;
        }
        bVar3 = 0xff;
      }
    }
    else {
LAB_0011749e:
      bVar3 = 0;
    }
    iVar1 = j->code_bits;
    j->code_buffer = j->code_buffer | (uint)bVar3 << (0x18U - (char)iVar1 & 0x1f);
    j->code_bits = iVar1 + 8;
    if (0x10 < iVar1) {
      return;
    }
  } while( true );
  sVar2 = '\0';
  if (psVar6->read_from_callbacks != 0) {
    ppsVar7 = &psVar6->img_buffer;
LAB_00117534:
    stbi__refill_buffer(psVar6);
    psVar5 = psVar6->img_buffer;
LAB_00117504:
    *ppsVar7 = psVar5 + 1;
    sVar2 = *psVar5;
  }
  goto LAB_0011750d;
}

Assistant:

static void stbi__grow_buffer_unsafe(stbi__jpeg *j)
{
   do {
      unsigned int b = j->nomore ? 0 : stbi__get8(j->s);
      if (b == 0xff) {
         int c = stbi__get8(j->s);
         while (c == 0xff) c = stbi__get8(j->s); // consume fill bytes
         if (c != 0) {
            j->marker = (unsigned char) c;
            j->nomore = 1;
            return;
         }
      }
      j->code_buffer |= b << (24 - j->code_bits);
      j->code_bits += 8;
   } while (j->code_bits <= 24);
}